

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddFixed32
          (UnknownFieldLiteParserHelper *this,uint32 num,uint32 value)

{
  undefined4 uStack_18;
  char buffer [4];
  
  _uStack_18 = (ulong)num;
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num * 8 + 5),this->unknown_);
    _uStack_18 = CONCAT44(value,uStack_18);
    std::__cxx11::string::append((char *)this->unknown_,(ulong)buffer);
  }
  return;
}

Assistant:

void AddFixed32(uint32 num, uint32 value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8 + 5, unknown_);
    char buffer[4];
    io::CodedOutputStream::WriteLittleEndian32ToArray(
        value, reinterpret_cast<uint8*>(buffer));
    unknown_->append(buffer, 4);
  }